

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode parse_numericrange(UA_String *str,UA_NumericRange *range)

{
  UA_Byte *pUVar1;
  UA_UInt32 UVar2;
  UA_NumericRangeDimension *__ptr;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  UA_UInt32 UVar8;
  ulong uVar9;
  UA_StatusCode UVar10;
  UA_NumericRangeDimension *__ptr_00;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  
  UVar10 = 0;
  uVar6 = 0;
  sVar7 = 0;
  __ptr_00 = (UA_NumericRangeDimension *)0x0;
  uVar11 = 0;
  do {
    __ptr = __ptr_00;
    uVar12 = uVar11;
    if (uVar11 <= sVar7) {
      uVar12 = uVar11 + 2;
      __ptr = (UA_NumericRangeDimension *)realloc(__ptr_00,uVar11 * 8 + 0x10);
      if (__ptr == (UA_NumericRangeDimension *)0x0) {
        UVar10 = 0x80030000;
        __ptr = __ptr_00;
        break;
      }
    }
    uVar11 = str->length;
    pUVar1 = str->data;
    uVar3 = uVar11 - uVar6;
    uVar5 = 0;
    if (pUVar1 != (UA_Byte *)0x0) {
      UVar2 = 0;
      do {
        UVar8 = UVar2;
        uVar9 = uVar5;
        uVar5 = uVar3;
        if (uVar3 <= uVar9) goto LAB_0011b707;
        bVar13 = (byte)(pUVar1[uVar9 + uVar6] - 0x30) < 10;
        uVar5 = uVar9 + 1;
        UVar2 = ((uint)pUVar1[uVar9 + uVar6] + UVar8 * 10) - 0x30;
      } while (bVar13);
      uVar5 = uVar9 + bVar13;
LAB_0011b707:
      __ptr[sVar7].min = UVar8;
    }
    if (uVar5 == 0) {
      uVar5 = 0;
    }
    else {
      uVar9 = uVar5 + 1;
      uVar4 = uVar3 - uVar9;
      if ((uVar3 < uVar9 || uVar4 == 0) || (pUVar1[uVar5 + uVar6] != ':')) {
        __ptr[sVar7].max = __ptr[sVar7].min;
      }
      else {
        if (pUVar1 == (UA_Byte *)0x0) {
          uVar4 = 0;
        }
        else {
          uVar5 = 0;
          UVar2 = 0;
          do {
            UVar8 = UVar2;
            uVar3 = uVar5;
            if (uVar4 <= uVar3) goto LAB_0011b75e;
            bVar13 = (byte)(pUVar1[uVar3 + uVar9 + uVar6] - 0x30) < 10;
            uVar5 = uVar3 + 1;
            UVar2 = ((uint)pUVar1[uVar3 + uVar9 + uVar6] + UVar8 * 10) - 0x30;
          } while (bVar13);
          uVar4 = uVar3 + bVar13;
LAB_0011b75e:
          __ptr[sVar7].max = UVar8;
        }
        if (uVar4 == 0) {
          uVar5 = 0;
        }
        else {
          uVar5 = uVar4 + uVar9;
          if (__ptr[sVar7].max <= __ptr[sVar7].min) {
            uVar5 = 0;
          }
        }
      }
    }
    if (uVar5 == 0) {
LAB_0011b7d6:
      bVar13 = false;
      UVar10 = 0x80360000;
    }
    else {
      uVar6 = uVar6 + uVar5;
      sVar7 = sVar7 + 1;
      if (uVar6 < uVar11) {
        if (pUVar1[uVar6] != ',') goto LAB_0011b7d6;
        uVar6 = uVar6 + 1;
        bVar13 = true;
      }
      else {
        bVar13 = false;
      }
    }
    __ptr_00 = __ptr;
    uVar11 = uVar12;
  } while (bVar13);
  if (sVar7 == 0 || UVar10 != 0) {
    free(__ptr);
  }
  else {
    range->dimensions = __ptr;
    range->dimensionsSize = sVar7;
  }
  return UVar10;
}

Assistant:

UA_StatusCode
parse_numericrange(const UA_String *str, UA_NumericRange *range) {
    size_t idx = 0;
    size_t dimensionsMax = 0;
    UA_NumericRangeDimension *dimensions = NULL;
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    size_t offset = 0;
    while(true) {
        /* alloc dimensions */
        if(idx >= dimensionsMax) {
            UA_NumericRangeDimension *newds;
            size_t newdssize = sizeof(UA_NumericRangeDimension) * (dimensionsMax + 2);
            newds = UA_realloc(dimensions, newdssize);
            if(!newds) {
                retval = UA_STATUSCODE_BADOUTOFMEMORY;
                break;
            }
            dimensions = newds;
            dimensionsMax = dimensionsMax + 2;
        }

        /* read the dimension */
        size_t progress = readDimension(&str->data[offset], str->length - offset,
                                        &dimensions[idx]);
        if(progress == 0) {
            retval = UA_STATUSCODE_BADINDEXRANGEINVALID;
            break;
        }
        offset += progress;
        ++idx;

        /* loop into the next dimension */
        if(offset >= str->length)
            break;

        if(str->data[offset] != ',') {
            retval = UA_STATUSCODE_BADINDEXRANGEINVALID;
            break;
        }
        ++offset;
    }

    if(retval == UA_STATUSCODE_GOOD && idx > 0) {
        range->dimensions = dimensions;
        range->dimensionsSize = idx;
    } else
        UA_free(dimensions);

    return retval;
}